

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::get_options
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this)

{
  byte bVar1;
  Display DVar2;
  pointer pOVar3;
  long in_RSI;
  unique_ptr<Sinclair::ZXSpectrum::Machine::Options,_std::default_delete<Sinclair::ZXSpectrum::Machine::Options>_>
  local_20;
  __single_object options;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this_local;
  
  std::make_unique<Sinclair::ZXSpectrum::Machine::Options,Configurable::OptionsType>
            ((OptionsType *)&local_20);
  bVar1 = *(byte *)(in_RSI + 0x359f9);
  pOVar3 = std::
           unique_ptr<Sinclair::ZXSpectrum::Machine::Options,_std::default_delete<Sinclair::ZXSpectrum::Machine::Options>_>
           ::operator->(&local_20);
  pOVar3->automatic_tape_motor_control = (bool)(bVar1 & 1);
  bVar1 = *(byte *)(in_RSI + 0x35a0c);
  pOVar3 = std::
           unique_ptr<Sinclair::ZXSpectrum::Machine::Options,_std::default_delete<Sinclair::ZXSpectrum::Machine::Options>_>
           ::operator->(&local_20);
  (pOVar3->super_QuickloadOption<Sinclair::ZXSpectrum::Machine::Options>).quickload =
       (bool)(bVar1 & 1);
  DVar2 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0xe8))
  ;
  pOVar3 = std::
           unique_ptr<Sinclair::ZXSpectrum::Machine::Options,_std::default_delete<Sinclair::ZXSpectrum::Machine::Options>_>
           ::operator->(&local_20);
  (pOVar3->super_DisplayOption<Sinclair::ZXSpectrum::Machine::Options>).output = DVar2;
  std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
  unique_ptr<Sinclair::ZXSpectrum::Machine::Options,std::default_delete<Sinclair::ZXSpectrum::Machine::Options>,void>
            ((unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)this,
             &local_20);
  std::
  unique_ptr<Sinclair::ZXSpectrum::Machine::Options,_std::default_delete<Sinclair::ZXSpectrum::Machine::Options>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);	// OptionsType is arbitrary, but not optional.
			options->automatic_tape_motor_control = use_automatic_tape_motor_control_;
			options->quickload = allow_fast_tape_hack_;
			options->output = get_video_signal_configurable();
			return options;
		}